

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Diag
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  long lVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t c;
  complex<long_double> pivot;
  int64_t r;
  char *in_stack_00000138;
  char *in_stack_00000140;
  complex<long_double> *in_stack_ffffffffffffff38;
  TPZBaseMatrix *__x;
  undefined1 local_88 [32];
  undefined1 local_68 [40];
  long local_40;
  undefined1 local_38 [32];
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (iVar2 != lVar3) {
    Error(in_stack_00000140,in_stack_00000138);
  }
  local_18 = 0;
  while( true ) {
    lVar3 = local_18;
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar4 <= lVar3) break;
    (**(code **)(*in_RDI + 0x120))(local_38,in_RDI,local_18,local_18);
    local_40 = 0;
    while( true ) {
      lVar3 = local_40;
      iVar2 = TPZBaseMatrix::Cols(local_10);
      lVar1 = local_18;
      lVar4 = local_40;
      if (iVar2 <= lVar3) break;
      __x = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_88,local_10,local_18,local_40);
      std::operator/((complex<long_double> *)__x,in_stack_ffffffffffffff38);
      (*(__x->super_TPZSavable)._vptr_TPZSavable[0x23])(__x,lVar1,lVar4,local_68);
      local_40 = local_40 + 1;
    }
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}